

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test9.cpp
# Opt level: O2

int main(void)

{
  Writer *pWVar1;
  function<void_(const_std::shared_ptr<mario::TcpConnection>_&,_mario::Buffer_*,_mario::Timestamp)>
  local_178;
  InetAddress listenAddr;
  TcpServer server;
  EventLoop loop;
  
  server._loop = (EventLoop *)&PTR__Writer_00135bd0;
  server._name._M_dataplus._M_p = (pointer)0x0;
  server._name._M_string_length._0_4_ = 0x80;
  server._name.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_3f0b;
  server._name.field_2._8_8_ = 0x1e;
  server._acceptor._M_t.
  super___uniq_ptr_impl<mario::Acceptor,_std::default_delete<mario::Acceptor>_>._M_t.
  super__Tuple_impl<0UL,_mario::Acceptor_*,_std::default_delete<mario::Acceptor>_>.
  super__Head_base<0UL,_mario::Acceptor_*,_false>._M_head_impl =
       (__uniq_ptr_data<mario::Acceptor,_std::default_delete<mario::Acceptor>,_true,_true>)
       anon_var_dwarf_5156;
  server._threadPool._M_t.
  super___uniq_ptr_impl<mario::EventLoopThreadPool,_std::default_delete<mario::EventLoopThreadPool>_>
  ._M_t.
  super__Tuple_impl<0UL,_mario::EventLoopThreadPool_*,_std::default_delete<mario::EventLoopThreadPool>_>
  .super__Head_base<0UL,_mario::EventLoopThreadPool_*,_false>._M_head_impl._0_2_ = 0;
  server._connectionCallback.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  server._connectionCallback.super__Function_base._M_functor._M_pod_data[8] = '\0';
  server._connectionCallback.super__Function_base._M_manager = (_Manager_type)0x0;
  server._connectionCallback._M_invoker = (_Invoker_type)0x122be3;
  server._messageCallback.super__Function_base._M_functor._0_4_ = 2;
  server._messageCallback.super__Function_base._M_functor._8_8_ = 0;
  server._messageCallback.super__Function_base._M_manager = (_Manager_type)0x0;
  server._messageCallback._M_invoker = (_Invoker_type)0x0;
  pWVar1 = el::base::Writer::construct((Writer *)&server,1,"default");
  pWVar1 = el::base::Writer::operator<<(pWVar1,(char (*) [13])"main: pid = ");
  loop._0_4_ = getpid();
  pWVar1 = el::base::Writer::operator<<(pWVar1,(int *)&loop);
  pWVar1 = el::base::Writer::operator<<(pWVar1,(char (*) [9])", tid = ");
  local_178.super__Function_base._M_functor._0_4_ = mario::CurrentThread::tid();
  el::base::Writer::operator<<(pWVar1,(int *)&local_178);
  el::base::Writer::~Writer((Writer *)&server);
  mario::InetAddress::InetAddress(&listenAddr,0x26fd);
  mario::EventLoop::EventLoop(&loop);
  mario::TcpServer::TcpServer(&server,&loop,&listenAddr);
  local_178.super__Function_base._M_functor._8_8_ = 0;
  local_178.super__Function_base._M_functor._M_unused._M_object = onConnection;
  local_178._M_invoker =
       std::
       _Function_handler<void_(const_std::shared_ptr<mario::TcpConnection>_&),_void_(*)(const_std::shared_ptr<mario::TcpConnection>_&)>
       ::_M_invoke;
  local_178.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::shared_ptr<mario::TcpConnection>_&),_void_(*)(const_std::shared_ptr<mario::TcpConnection>_&)>
       ::_M_manager;
  std::function<void_(const_std::shared_ptr<mario::TcpConnection>_&)>::operator=
            (&server._connectionCallback,
             (function<void_(const_std::shared_ptr<mario::TcpConnection>_&)> *)&local_178);
  std::_Function_base::~_Function_base(&local_178.super__Function_base);
  local_178.super__Function_base._M_functor._8_8_ = 0;
  local_178.super__Function_base._M_functor._M_unused._M_object = onMessage;
  local_178._M_invoker =
       std::
       _Function_handler<void_(const_std::shared_ptr<mario::TcpConnection>_&,_mario::Buffer_*,_mario::Timestamp),_void_(*)(const_std::shared_ptr<mario::TcpConnection>_&,_mario::Buffer_*,_mario::Timestamp)>
       ::_M_invoke;
  local_178.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::shared_ptr<mario::TcpConnection>_&,_mario::Buffer_*,_mario::Timestamp),_void_(*)(const_std::shared_ptr<mario::TcpConnection>_&,_mario::Buffer_*,_mario::Timestamp)>
       ::_M_manager;
  std::
  function<void_(const_std::shared_ptr<mario::TcpConnection>_&,_mario::Buffer_*,_mario::Timestamp)>
  ::operator=(&server._messageCallback,&local_178);
  std::_Function_base::~_Function_base(&local_178.super__Function_base);
  mario::TcpServer::setThreadNum(&server,3);
  mario::TcpServer::start(&server);
  mario::EventLoop::loop(&loop);
  mario::TcpServer::~TcpServer(&server);
  mario::EventLoop::~EventLoop(&loop);
  return 0;
}

Assistant:

INITIALIZE_EASYLOGGINGPP

int main() {
    LOG(INFO) << "main: pid = "<< getpid() << ", tid = " << mario::CurrentThread::tid();

    mario::InetAddress listenAddr(9981);
    mario::EventLoop loop;

    mario::TcpServer server(&loop, listenAddr);
    server.setConnectionCallback(onConnection);
    server.setMessageCallback(onMessage);
    server.setThreadNum(3);
    server.start();

    loop.loop();
}